

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

ChLoad<MyLoaderPointStiff> * __thiscall
chrono::ChLoad<MyLoaderPointStiff>::Clone(ChLoad<MyLoaderPointStiff> *this)

{
  ChLoad<MyLoaderPointStiff> *this_00;
  
  this_00 = (ChLoad<MyLoaderPointStiff> *)operator_new(0x80);
  ChLoadBase::ChLoadBase((ChLoadBase *)this_00,&this->super_ChLoadBase);
  *(undefined ***)this_00 = &PTR__ChLoad_00146280;
  ChLoaderUVWatomic::ChLoaderUVWatomic
            (&(this_00->loader).super_ChLoaderUVWatomic,&(this->loader).super_ChLoaderUVWatomic);
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00146350;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }